

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O2

xmlChar * xmlParseStringEntityRef(xmlParserCtxtPtr ctxt,xmlChar **str)

{
  xmlChar *pxVar1;
  xmlChar *pxVar2;
  xmlChar *local_28;
  
  if (((str == (xmlChar **)0x0) || (local_28 = *str, local_28 == (xmlChar *)0x0)) ||
     (*local_28 != '&')) {
    pxVar2 = (xmlChar *)0x0;
  }
  else {
    local_28 = local_28 + 1;
    pxVar2 = xmlParseStringName(ctxt,&local_28);
    pxVar1 = local_28;
    if (pxVar2 == (xmlChar *)0x0) {
      xmlFatalErrMsg(ctxt,XML_ERR_NAME_REQUIRED,"xmlParseStringEntityRef: no name\n");
      pxVar2 = (xmlChar *)0x0;
    }
    else if (*local_28 == ';') {
      local_28 = local_28 + 1;
    }
    else {
      xmlFatalErr(ctxt,XML_ERR_ENTITYREF_SEMICOL_MISSING,(char *)0x0);
      (*xmlFree)(pxVar2);
      pxVar2 = (xmlChar *)0x0;
      local_28 = pxVar1;
    }
    *str = local_28;
  }
  return pxVar2;
}

Assistant:

static xmlChar *
xmlParseStringEntityRef(xmlParserCtxtPtr ctxt, const xmlChar ** str) {
    xmlChar *name;
    const xmlChar *ptr;
    xmlChar cur;

    if ((str == NULL) || (*str == NULL))
        return(NULL);
    ptr = *str;
    cur = *ptr;
    if (cur != '&')
	return(NULL);

    ptr++;
    name = xmlParseStringName(ctxt, &ptr);
    if (name == NULL) {
	xmlFatalErrMsg(ctxt, XML_ERR_NAME_REQUIRED,
		       "xmlParseStringEntityRef: no name\n");
	*str = ptr;
	return(NULL);
    }
    if (*ptr != ';') {
	xmlFatalErr(ctxt, XML_ERR_ENTITYREF_SEMICOL_MISSING, NULL);
        xmlFree(name);
	*str = ptr;
	return(NULL);
    }
    ptr++;

    *str = ptr;
    return(name);
}